

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::Arena::AllocateAligned(Arena *this,type_info *allocated,size_t n)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong n_00;
  long *in_FS_OFFSET;
  
  n_00 = n + 7 & 0xfffffffffffffff8;
  if ((*(long *)(this + 0x38) != 0) && (*(code **)(this + 0x88) != (code *)0x0)) {
    (**(code **)(this + 0x88))(allocated,n_00);
  }
  plVar1 = (long *)*in_FS_OFFSET;
  if ((((*plVar1 == *(long *)this) &&
       (puVar3 = (undefined8 *)plVar1[1], puVar3 != (undefined8 *)0x0)) ||
      ((puVar3 = *(undefined8 **)(this + 0x10), puVar3 != (undefined8 *)0x0 &&
       ((long *)*puVar3 == plVar1)))) && (lVar2 = puVar3[2], n_00 <= (ulong)(puVar3[3] - lVar2))) {
    puVar3[2] = n_00 + lVar2;
    return (void *)((long)puVar3 + lVar2);
  }
  pvVar4 = SlowAlloc(this,n_00);
  return pvVar4;
}

Assistant:

void* Arena::AllocateAligned(const std::type_info* allocated, size_t n) {
  // Align n to next multiple of 8 (from Hacker's Delight, Chapter 3.)
  n = (n + 7) & -8;

  // Monitor allocation if needed.
  if (GOOGLE_PREDICT_FALSE(hooks_cookie_ != NULL) &&
      options_.on_arena_allocation != NULL) {
    options_.on_arena_allocation(allocated, n, hooks_cookie_);
  }

  // If this thread already owns a block in this arena then try to use that.
  // This fast path optimizes the case where multiple threads allocate from the
  // same arena.
  if (thread_cache().last_lifecycle_id_seen == lifecycle_id_ &&
      thread_cache().last_block_used_ != NULL) {
    if (thread_cache().last_block_used_->avail() < n) {
      return SlowAlloc(n);
    }
    return AllocFromBlock(thread_cache().last_block_used_, n);
  }

  // Check whether we own the last accessed block on this arena.
  // This fast path optimizes the case where a single thread uses multiple
  // arenas.
  void* me = &thread_cache();
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::Acquire_Load(&hint_));
  if (!b || b->owner != me || b->avail() < n) {
    return SlowAlloc(n);
  }
  return AllocFromBlock(b, n);
}